

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::AddSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<long_double>_> *pA)

{
  long lVar1;
  int64_t r;
  int64_t c;
  int64_t iVar2;
  int64_t col;
  int64_t iVar3;
  longdouble lVar4;
  longdouble lVar5;
  long local_b0;
  complex<long_double> __r;
  longdouble local_78;
  longdouble local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar1 = rowSize + pRow;
  local_b0 = sRow;
  if (((pA->super_TPZBaseMatrix).fRow < lVar1) || ((pA->super_TPZBaseMatrix).fCol < colSize + pCol))
  {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  while( true ) {
    iVar2 = pCol;
    iVar3 = sCol;
    if (lVar1 <= pRow) break;
    for (; iVar2 < colSize + pCol; iVar2 = iVar2 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_58,this,local_b0,iVar3);
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_78,pA,pRow,iVar2);
      __r._M_value._8_2_ = SUB42(uStack_50,0);
      __r._M_value._10_2_ = SUB42((uint)uStack_50 >> 0x10,0);
      __r._M_value._12_4_ = uStack_4c;
      __r._M_value._24_2_ = SUB42(uStack_40,0);
      __r._M_value._26_2_ = SUB42((uint)uStack_40 >> 0x10,0);
      __r._M_value._28_4_ = uStack_3c;
      lVar5 = (longdouble)CONCAT28(__r._M_value._8_2_,CONCAT44(uStack_54,local_58)) + local_78;
      lVar4 = (longdouble)CONCAT28(__r._M_value._24_2_,CONCAT44(uStack_44,local_48)) + local_68;
      __r._M_value._0_4_ = SUB104(lVar5,0);
      __r._M_value._4_4_ = SUB104((unkuint10)lVar5 >> 0x20,0);
      __r._M_value._8_2_ = SUB102((unkuint10)lVar5 >> 0x40,0);
      __r._M_value._16_4_ = SUB104(lVar4,0);
      __r._M_value._20_4_ = SUB104((unkuint10)lVar4 >> 0x20,0);
      __r._M_value._24_2_ = SUB102((unkuint10)lVar4 >> 0x40,0);
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(pA,pRow,iVar2,&__r);
      iVar3 = iVar3 + 1;
    }
    pRow = pRow + 1;
    local_b0 = local_b0 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}